

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,string *directory,string *fullName)

{
  RegularExpression *this_00;
  bool bVar1;
  mapped_type *this_01;
  iterator iVar2;
  UnscannedEntry entry;
  string line;
  string local_50;
  
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
            ::operator[](&this->FileCache,fullName);
  this_01->Used = true;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = &this->IncludeRegexLine;
  do {
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream(is,&line,(bool *)0x0,0xffffffffffffffff);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&line);
        return;
      }
      if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        TransformLine(this,&line);
      }
      bVar1 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
    } while (!bVar1);
    entry.FileName._M_dataplus._M_p = (pointer)&entry.FileName.field_2;
    entry.FileName._M_string_length = 0;
    entry.FileName.field_2._M_local_buf[0] = '\0';
    entry.QuotedLocation._M_dataplus._M_p = (pointer)&entry.QuotedLocation.field_2;
    entry.QuotedLocation._M_string_length = 0;
    entry.QuotedLocation.field_2._M_local_buf[0] = '\0';
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&this_00->regmatch,2);
    std::__cxx11::string::operator=((string *)&entry,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::SystemTools::ConvertToUnixSlashes(&entry.FileName);
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&this_00->regmatch,3);
    bVar1 = std::operator==(&local_50,"\"");
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsFullPath(&entry.FileName);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) {
        cmsys::SystemTools::CollapseFullPath(&local_50,&entry.FileName,directory);
        std::__cxx11::string::operator=((string *)&entry.QuotedLocation,(string *)&local_50);
        goto LAB_0052309a;
      }
    }
    else {
LAB_0052309a:
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexScan,entry.FileName._M_dataplus._M_p);
    if (bVar1) {
      std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
      push_back(&this_01->UnscannedEntries,&entry);
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->Encountered)._M_t,&entry.FileName);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->Encountered,&entry.FileName);
        std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back(&(this->Unscanned).c,&entry);
      }
    }
    UnscannedEntry::~UnscannedEntry(&entry);
  } while( true );
}

Assistant:

void cmDependsC::Scan(std::istream& is, const std::string& directory,
                      const std::string& fullName)
{
  cmIncludeLines& newCacheEntry = this->FileCache[fullName];
  newCacheEntry.Used = true;

  // Read one line at a time.
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    // Transform the line content first.
    if (!this->TransformRules.empty()) {
      this->TransformLine(line);
    }

    // Match include directives.
    if (this->IncludeRegexLine.find(line)) {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if (this->IncludeRegexLine.match(3) == "\"" &&
          !cmSystemTools::FileIsFullPath(entry.FileName)) {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseFullPath(entry.FileName, directory);
      }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName)) {
        newCacheEntry.UnscannedEntries.push_back(entry);
        if (this->Encountered.find(entry.FileName) ==
            this->Encountered.end()) {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
        }
      }
    }
  }
}